

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priest.c
# Opt level: O2

void intemple(int roomno)

{
  bool bVar1;
  char cVar2;
  boolean bVar3;
  boolean bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  monst *pmVar8;
  obj *poVar9;
  char *pcVar10;
  char *line;
  char *__s;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  char buf [256];
  
  pmVar8 = findpriest((char)roomno);
  cVar2 = temple_occupied(u.urooms0);
  if (cVar2 != '\0') {
    return;
  }
  if (pmVar8 != (monst *)0x0) {
    bVar3 = has_shrine(pmVar8);
    bVar4 = on_level(&u.uz,&dungeon_topology.d_sanctum_level);
    bVar11 = bVar4 == '\0';
    bVar12 = u.uz.dnum != dungeon_topology.d_astral_level.dnum;
    uVar6 = *(uint *)&pmVar8->field_0x60;
    bVar13 = (uVar6 & 0xc0000) == 0x40000;
    bVar14 = flags.soundok != '\0';
    if (!bVar14 || !bVar13) goto LAB_0021a808;
    if (!bVar12 || !bVar11) {
      uVar5 = uVar6;
      if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
        if ((u.umonnum == u.umonster) || (bVar4 = dmgtype(youmonst.data,0x24), bVar4 == '\0'))
        goto LAB_0021a506;
        uVar5 = *(uint *)&pmVar8->field_0x60;
      }
      *(uint *)&pmVar8->field_0x60 = uVar5 & 0xefffffff;
    }
LAB_0021a506:
    if (pmVar8->wormno == '\0') {
      if ((viz_array[pmVar8->my][pmVar8->mx] & 2U) != 0) goto LAB_0021a786;
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0021a6f5;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0021a6ec;
      }
      else {
LAB_0021a6ec:
        if (ublindf == (obj *)0x0) goto LAB_0021a7e5;
LAB_0021a6f5:
        if (ublindf->oartifact != '\x1d') goto LAB_0021a7e5;
      }
      if ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
         (((youmonst.data)->mflags3 & 0x100) == 0)) goto LAB_0021a7e5;
      pcVar10 = "A nearby voice";
      if (((viz_array[pmVar8->my][pmVar8->mx] & 1U) != 0) && ((pmVar8->data->mflags3 & 0x200) != 0))
      goto LAB_0021a786;
    }
    else {
      bVar4 = worm_known(level,pmVar8);
      if (bVar4 != '\0') {
LAB_0021a786:
        uVar5 = *(uint *)&pmVar8->field_0x60;
        if ((((uVar5 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)
           ) {
          if ((uVar5 & 0x280) != 0) goto LAB_0021a7e5;
        }
        else {
          pcVar10 = "A nearby voice";
          if (((uVar5 & 0x280) != 0) || (((youmonst.data)->mflags1 & 0x1000000) == 0))
          goto LAB_0021a7ec;
        }
        if ((u._1052_1_ & 0x20) == 0) {
          pcVar10 = Monnam(pmVar8);
          goto LAB_0021a7ec;
        }
      }
LAB_0021a7e5:
      pcVar10 = "A nearby voice";
    }
LAB_0021a7ec:
    pline("%s intones:",pcVar10);
    *(uint *)&pmVar8->field_0x60 = *(uint *)&pmVar8->field_0x60 & 0xefffffff | uVar6 & 0x10000000;
LAB_0021a808:
    if ((bVar12 && bVar11) ||
       (bVar4 = on_level(&u.uz,&dungeon_topology.d_sanctum_level), bVar4 == '\0')) {
      pcVar10 = "sacred";
      if (bVar3 == '\0') {
        pcVar10 = "desecrated";
      }
      line = (char *)0x0;
      __s = buf;
      sprintf(__s,"Pilgrim, you enter a %s place!",pcVar10);
      bVar1 = true;
    }
    else if ((*(uint *)&pmVar8->field_0x60 >> 0x16 & 1) == 0) {
      __s = "You desecrate this place by your presence!";
      bVar1 = true;
      line = (char *)0x0;
    }
    else {
      *(uint *)&pmVar8->field_0x60 = *(uint *)&pmVar8->field_0x60 & 0xffbfffff;
      set_malign(pmVar8);
      __s = "Infidel, you have entered Moloch\'s Sanctum!";
      line = "Be gone!";
      bVar1 = false;
    }
    if ((bVar14 && bVar13) && (verbalize(__s), !bVar1)) {
      verbalize(line);
    }
    if (!bVar12 || !bVar11) {
      return;
    }
    if (bVar3 == '\0') {
      pcVar10 = "";
    }
    else {
      pcVar10 = " strange";
      if ((u.ualign.type == pmVar8->field_0x74) && (-4 < u.ualign.record)) {
        pline("You experience a strange sense of peace."," strange");
        return;
      }
    }
    pline("You have a%s forbidding feeling...",pcVar10);
    return;
  }
  uVar6 = mt_random();
  if (uVar6 % 3 == 1) {
    pcVar10 = "You feel like you are being watched.";
LAB_0021a55b:
    pline(pcVar10);
  }
  else {
    if (uVar6 % 3 == 0) {
      pcVar10 = "You have an eerie feeling...";
      goto LAB_0021a55b;
    }
    pcVar10 = body_part(0xc);
    pline("A shiver runs down your %s.",pcVar10);
  }
  uVar6 = mt_random();
  if (uVar6 % 5 != 0) {
    return;
  }
  pmVar8 = makemon(mons + 0x12a,level,(int)u.ux,(int)u.uy,0);
  if (pmVar8 == (monst *)0x0) {
    return;
  }
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0021a5e4;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0021a5df;
  }
  else {
LAB_0021a5df:
    if (ublindf != (obj *)0x0) {
LAB_0021a5e4:
      if (ublindf->oartifact == '\x1d') goto LAB_0021a992;
    }
    if (((pmVar8->data->mflags1 & 0x10000) == 0) &&
       ((poVar9 = which_armor(pmVar8,4), poVar9 == (obj *)0x0 ||
        (poVar9 = which_armor(pmVar8,4), poVar9->otyp != 0x4f)))) {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0021a639;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0021a634;
      }
      else {
LAB_0021a634:
        if (ublindf != (obj *)0x0) {
LAB_0021a639:
          if (ublindf->oartifact == '\x1d') goto LAB_0021a935;
        }
        if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
             (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
             youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0)) goto LAB_0021a992;
      }
LAB_0021a935:
      if ((u.uprops[0x19].extrinsic == 0) || (u.uprops[0x19].blocked != 0)) goto LAB_0021a97c;
      iVar7 = dist2((int)pmVar8->mx,(int)pmVar8->my,(int)u.ux,(int)u.uy);
      pcVar10 = "An enormous ghost appears next to you!";
      if ((iVar7 < 0x41) || (u.uprops[0x42].intrinsic != 0)) goto LAB_0021a999;
    }
    else {
LAB_0021a97c:
      if (u.uprops[0x42].intrinsic != 0) goto LAB_0021a992;
    }
    if (u.uprops[0x42].extrinsic == 0) {
      bVar3 = match_warn_of_mon(pmVar8);
      pcVar10 = "An enormous ghost appears next to you!";
      if (bVar3 == '\0') {
        pcVar10 = "You sense a presence close by!";
      }
      goto LAB_0021a999;
    }
  }
LAB_0021a992:
  pcVar10 = "An enormous ghost appears next to you!";
LAB_0021a999:
  pline(pcVar10);
  pmVar8->field_0x62 = pmVar8->field_0x62 & 0xbf;
  set_malign(pmVar8);
  if (flags.verbose != '\0') {
    pline("You are frightened to death, and unable to move.");
  }
  nomul(-3,"frightened to death");
  nomovemsg = "You regain your composure.";
  return;
}

Assistant:

void intemple(int roomno)
{
	struct monst *priest = findpriest((char)roomno);
	boolean tended = (priest != NULL);
	boolean shrined, sanctum, can_speak;
	const char *msg1, *msg2;
	char buf[BUFSZ];

	if (!temple_occupied(u.urooms0)) {
	    if (tended) {
		shrined = has_shrine(priest);
		sanctum = (Is_sanctum(&u.uz) || In_endgame(&u.uz));
		can_speak = (priest->mcanmove && !priest->msleeping &&
			     flags.soundok);
		if (can_speak) {
		    unsigned save_priest = priest->ispriest;
		    /* don't reveal the altar's owner upon temple entry in
		       the endgame; for the Sanctum, the next message names
		       Moloch so suppress the "of Moloch" for him here too */
		    if (sanctum && !Hallucination) priest->ispriest = 0;
		    pline("%s intones:",
			canseemon(level, priest) ? Monnam(priest) : "A nearby voice");
		    priest->ispriest = save_priest;
		}
		msg2 = 0;
		if (sanctum && Is_sanctum(&u.uz)) {
		    if (priest->mpeaceful) {
			msg1 = "Infidel, you have entered Moloch's Sanctum!";
			msg2 = "Be gone!";
			priest->mpeaceful = 0;
			set_malign(priest);
		    } else
			msg1 = "You desecrate this place by your presence!";
		} else {
		    sprintf(buf, "Pilgrim, you enter a %s place!",
			    !shrined ? "desecrated" : "sacred");
		    msg1 = buf;
		}
		if (can_speak) {
		    verbalize(msg1);
		    if (msg2) verbalize(msg2);
		}
		if (!sanctum) {
		    /* !tended -> !shrined */
		    if (!shrined || !p_coaligned(priest) ||
			    u.ualign.record <= ALGN_SINNED)
			pline("You have a%s forbidding feeling...",
				(!shrined) ? "" : " strange");
		    else pline("You experience a strange sense of peace.");
		}
	    } else {
		switch(rn2(3)) {
		  case 0: pline("You have an eerie feeling..."); break;
		  case 1: pline("You feel like you are being watched."); break;
		  default: pline("A shiver runs down your %s.",
			body_part(SPINE)); break;
		}
		if (!rn2(5)) {
		    struct monst *mtmp;

		    if (!(mtmp = makemon(&mons[PM_GHOST], level, u.ux, u.uy, 
			                 NO_MM_FLAGS)))
			return;
		    if (!Blind || sensemon(mtmp))
			pline("An enormous ghost appears next to you!");
		    else pline("You sense a presence close by!");
		    mtmp->mpeaceful = 0;
		    set_malign(mtmp);
		    if (flags.verbose)
			pline("You are frightened to death, and unable to move.");
		    nomul(-3, "frightened to death");
		    nomovemsg = "You regain your composure.";
	       }
	   }
       }
}